

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngdec.c
# Opt level: O3

int ReadPNG(uint8_t *data,size_t data_size,WebPPicture *pic,int keep_alpha,Metadata *metadata)

{
  byte bVar1;
  int iVar2;
  __jmp_buf_tag *__env;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  uint64_t stride;
  uint8_t *puVar6;
  png_structp png;
  png_infop info;
  png_uint_32 height;
  int ok;
  double image_gamma;
  uint8_t *rgb;
  png_infop end_info;
  png_uint_32 width;
  int color_type;
  int bit_depth;
  int srgb_intent;
  int interlaced;
  png_structp local_a8;
  byte local_99;
  png_infop local_98;
  uint local_90;
  int local_8c;
  uint8_t *local_88;
  uint8_t *local_80;
  png_infop local_78;
  int local_6c;
  uint local_68;
  uint local_64;
  int local_60;
  int local_5c;
  Metadata *local_58;
  undefined1 local_50 [4];
  undefined1 local_4c [4];
  uint8_t *local_48;
  size_t local_40;
  undefined8 local_38;
  
  local_a8 = (png_structp)0x0;
  local_98 = (png_infop)0x0;
  local_78 = (png_infop)0x0;
  local_38 = 0;
  local_8c = 0;
  local_80 = (uint8_t *)0x0;
  if (pic == (WebPPicture *)0x0 || (data_size == 0 || data == (uint8_t *)0x0)) {
    return 0;
  }
  local_48 = data;
  local_40 = data_size;
  local_a8 = (png_structp)png_create_read_struct_2("1.6.37",0,0,0,0,MallocFunc,FreeFunc);
  if (local_a8 == (png_structp)0x0) goto LAB_001052f4;
  png_set_error_fn(local_a8,0,error_function);
  __env = (__jmp_buf_tag *)png_set_longjmp_fn(local_a8,longjmp,200);
  iVar2 = _setjmp(__env);
  if (iVar2 == 0) {
    uVar3 = png_get_chunk_malloc_max(local_a8);
    if ((data_size < 0x1000000) && (uVar3 < data_size)) {
      png_set_chunk_malloc_max(local_a8,data_size);
    }
    local_98 = (png_infop)png_create_info_struct(local_a8);
    if ((local_98 != (png_infop)0x0) &&
       (local_78 = (png_infop)png_create_info_struct(local_a8), local_78 != (png_infop)0x0)) {
      png_set_read_fn(local_a8,&local_48,ReadFunc);
      png_read_info(local_a8,local_98);
      iVar2 = png_get_IHDR(local_a8,local_98,&local_68,&local_90,&local_5c,&local_64,local_4c,0,0);
      if (iVar2 != 0) {
        png_set_strip_16(local_a8);
        png_set_packing(local_a8);
        if (local_64 == 3) {
          png_set_palette_to_rgb(local_a8);
        }
        if ((local_64 & 0xfffffffb) == 0) {
          if (local_5c < 8) {
            png_set_expand_gray_1_2_4_to_8(local_a8);
          }
          png_set_gray_to_rgb(local_a8);
        }
        iVar2 = png_get_valid(local_a8,local_98,0x10);
        if (iVar2 != 0) {
          png_set_tRNS_to_alpha(local_a8);
        }
        local_88 = (uint8_t *)0x3fdd1745d1745d17;
        iVar2 = png_get_sRGB(local_a8,local_98,local_50);
        if (iVar2 == 0) {
          iVar2 = png_get_gAMA(local_a8,local_98,&local_88);
          puVar6 = local_88;
          if (iVar2 != 0) goto LAB_001054ac;
        }
        else {
          puVar6 = (uint8_t *)0x3fdd1745d1745d17;
LAB_001054ac:
          png_set_gamma(0x9999999a,puVar6,local_a8);
        }
        if (keep_alpha == 0) {
          png_set_strip_alpha(local_a8);
        }
        local_6c = png_set_interlace_handling(local_a8);
        png_read_update_info(local_a8,local_98);
        bVar1 = png_get_channels(local_a8,local_98);
        if (((0xfd < (byte)(bVar1 - 5)) &&
            (stride = (ulong)local_68 * (ulong)bVar1, stride < 0x80000000)) &&
           (iVar2 = ImgIoUtilCheckSizeArgumentsOverflow(stride,(ulong)local_90), iVar2 != 0)) {
          uVar3 = (ulong)local_90;
          local_80 = (uint8_t *)malloc(stride * uVar3);
          if (local_80 != (uint8_t *)0x0) {
            local_99 = bVar1;
            local_58 = metadata;
            if (0 < local_6c) {
              iVar2 = 0;
              do {
                local_88 = local_80;
                uVar4 = 0;
                local_60 = iVar2;
                if ((int)uVar3 != 0) {
                  uVar5 = 0;
                  do {
                    png_read_rows(local_a8,&local_88,0,1);
                    local_88 = local_88 + stride;
                    uVar5 = uVar5 + 1;
                    uVar4 = (ulong)local_90;
                  } while (uVar5 < local_90);
                }
                iVar2 = local_60 + 1;
                uVar3 = uVar4;
              } while (iVar2 != local_6c);
            }
            png_read_end(local_a8,local_78);
            metadata = local_58;
            if ((local_58 == (Metadata *)0x0) ||
               (iVar2 = ExtractMetadataFromPNG(local_a8,local_98,local_78,local_58), iVar2 != 0)) {
              pic->width = local_68;
              pic->height = local_90;
              if (local_99 == 4) {
                local_8c = WebPPictureImportRGBA(pic,local_80,(int)stride);
              }
              else {
                local_8c = WebPPictureImportRGB(pic,local_80,(int)stride);
              }
              if (local_8c != 0) goto LAB_001052f4;
            }
            else {
              ReadPNG_cold_1();
            }
          }
        }
      }
    }
  }
  MetadataFree(metadata);
LAB_001052f4:
  if (local_a8 != (png_structp)0x0) {
    png_destroy_read_struct(&local_a8,&local_98,&local_78);
  }
  free(local_80);
  return local_8c;
}

Assistant:

int ReadPNG(const uint8_t* const data, size_t data_size,
            struct WebPPicture* const pic,
            int keep_alpha, struct Metadata* const metadata) {
  volatile png_structp png = NULL;
  volatile png_infop info = NULL;
  volatile png_infop end_info = NULL;
  PNGReadContext context = { NULL, 0, 0 };
  int color_type, bit_depth, interlaced;
  int num_channels;
  int num_passes;
  int p;
  volatile int ok = 0;
  png_uint_32 width, height, y;
  int64_t stride;
  uint8_t* volatile rgb = NULL;

  if (data == NULL || data_size == 0 || pic == NULL) return 0;

  context.data = data;
  context.data_size = data_size;

  png = png_create_read_struct_2(PNG_LIBPNG_VER_STRING, NULL, NULL, NULL,
                                 NULL, MallocFunc, FreeFunc);
  if (png == NULL) goto End;

  png_set_error_fn(png, 0, error_function, NULL);
  if (setjmp(png_jmpbuf(png))) {
 Error:
    MetadataFree(metadata);
    goto End;
  }

#if LOCAL_PNG_PREREQ(1,5) || \
    (LOCAL_PNG_PREREQ(1,4) && PNG_LIBPNG_VER_RELEASE >= 1)
  // If it looks like the bitstream is going to need more memory than libpng's
  // internal limit (default: 8M), try to (reasonably) raise it.
  if (data_size > png_get_chunk_malloc_max(png) && data_size < (1u << 24)) {
    png_set_chunk_malloc_max(png, data_size);
  }
#endif

  info = png_create_info_struct(png);
  if (info == NULL) goto Error;
  end_info = png_create_info_struct(png);
  if (end_info == NULL) goto Error;

  png_set_read_fn(png, &context, ReadFunc);
  png_read_info(png, info);
  if (!png_get_IHDR(png, info,
                    &width, &height, &bit_depth, &color_type, &interlaced,
                    NULL, NULL)) goto Error;

  png_set_strip_16(png);
  png_set_packing(png);
  if (color_type == PNG_COLOR_TYPE_PALETTE) {
    png_set_palette_to_rgb(png);
  }
  if (color_type == PNG_COLOR_TYPE_GRAY ||
      color_type == PNG_COLOR_TYPE_GRAY_ALPHA) {
    if (bit_depth < 8) {
      png_set_expand_gray_1_2_4_to_8(png);
    }
    png_set_gray_to_rgb(png);
  }
  if (png_get_valid(png, info, PNG_INFO_tRNS)) {
    png_set_tRNS_to_alpha(png);
  }

  // Apply gamma correction if needed.
  {
    double image_gamma = 1 / 2.2, screen_gamma = 2.2;
    int srgb_intent;
    if (png_get_sRGB(png, info, &srgb_intent) ||
        png_get_gAMA(png, info, &image_gamma)) {
      png_set_gamma(png, screen_gamma, image_gamma);
    }
  }

  if (!keep_alpha) {
    png_set_strip_alpha(png);
  }

  num_passes = png_set_interlace_handling(png);
  png_read_update_info(png, info);

  num_channels = png_get_channels(png, info);
  if (num_channels != 3 && num_channels != 4) {
    goto Error;
  }
  stride = (int64_t)num_channels * width * sizeof(*rgb);
  if (stride != (int)stride ||
      !ImgIoUtilCheckSizeArgumentsOverflow(stride, height)) {
    goto Error;
  }

  rgb = (uint8_t*)malloc((size_t)stride * height);
  if (rgb == NULL) goto Error;
  for (p = 0; p < num_passes; ++p) {
    png_bytep row = rgb;
    for (y = 0; y < height; ++y) {
      png_read_rows(png, &row, NULL, 1);
      row += stride;
    }
  }
  png_read_end(png, end_info);

  if (metadata != NULL &&
      !ExtractMetadataFromPNG(png, info, end_info, metadata)) {
    fprintf(stderr, "Error extracting PNG metadata!\n");
    goto Error;
  }

  pic->width = (int)width;
  pic->height = (int)height;
  ok = (num_channels == 4) ? WebPPictureImportRGBA(pic, rgb, (int)stride)
                           : WebPPictureImportRGB(pic, rgb, (int)stride);

  if (!ok) {
    goto Error;
  }

 End:
  if (png != NULL) {
    png_destroy_read_struct((png_structpp)&png,
                            (png_infopp)&info, (png_infopp)&end_info);
  }
  free(rgb);
  return ok;
}